

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  object *poVar1;
  
LAB_0020beca:
  switch((byte)*(object_storage *)this & 0xf) {
  case 4:
    return true;
  default:
    return false;
  case 7:
    return (byte)*(object_storage *)this < 0x10;
  case 8:
  case 9:
    goto switchD_0020bee1_caseD_8;
  case 0xc:
    return *(long *)(*(long *)((long)this + 8) + 0x18) == 0;
  case 0xd:
    poVar1 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage
             ::value_abi_cxx11_((object_storage *)this);
    break;
  case 0xe:
    poVar1 = *(object **)((long)this + 8);
    break;
  case 0xf:
    return *(long *)(*(long *)((long)this + 8) + 0x10) == 0;
  }
  return (poVar1->members_).
         super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (poVar1->members_).
         super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
switchD_0020bee1_caseD_8:
  this = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
          ((long)this + 8);
  goto LAB_0020beca;
}

Assistant:

bool empty() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return cast<byte_string_storage>().length() == 0;
                    break;
                case json_storage_kind::short_str:
                    return cast<short_string_storage>().length() == 0;
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().length() == 0;
                case json_storage_kind::array:
                    return cast<array_storage>().value().empty();
                case json_storage_kind::empty_object:
                    return true;
                case json_storage_kind::object:
                    return cast<object_storage>().value().empty();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().empty();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().empty();
                default:
                    return false;
            }
        }